

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

void __thiscall FrameProtector::~FrameProtector(FrameProtector *this)

{
  Frame *this_00;
  FrameProtector *this_local;
  
  if (g_current_frame == (Frame *)0x0) {
    __assert_fail("g_current_frame != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x5f,"FrameProtector::~FrameProtector()");
  }
  g_current_frame = Frame::GetParent(g_current_frame);
  if (g_current_frame != (Frame *)0x0) {
    this_00 = this->protected_frame;
    if (this_00 != (Frame *)0x0) {
      Frame::~Frame(this_00);
      operator_delete(this_00,0x40);
    }
    return;
  }
  __assert_fail("g_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x61,"FrameProtector::~FrameProtector()");
}

Assistant:

~FrameProtector() {
    assert(g_current_frame != nullptr);
    g_current_frame = g_current_frame->GetParent();
    assert(g_current_frame != nullptr);
    delete protected_frame;
  }